

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

aom_variance_fn_t get_block_variance_fn(BLOCK_SIZE bsize)

{
  BLOCK_SIZE bsize_local;
  _func_uint_uint8_t_ptr_int_uint8_t_ptr_int_uint_ptr *local_8;
  
  if (bsize == BLOCK_8X8) {
    local_8 = aom_mse8x8_sse2;
  }
  else if (bsize == BLOCK_8X16) {
    local_8 = aom_mse8x16_sse2;
  }
  else if (bsize == BLOCK_16X8) {
    local_8 = aom_mse16x8_sse2;
  }
  else {
    local_8 = aom_mse16x16;
  }
  return local_8;
}

Assistant:

static aom_variance_fn_t get_block_variance_fn(BLOCK_SIZE bsize) {
  switch (bsize) {
    case BLOCK_8X8: return aom_mse8x8;
    case BLOCK_16X8: return aom_mse16x8;
    case BLOCK_8X16: return aom_mse8x16;
    default: return aom_mse16x16;
  }
}